

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBinPacker.cxx
# Opt level: O0

bool __thiscall
cmCTestBinPackerAllocation::operator==
          (cmCTestBinPackerAllocation *this,cmCTestBinPackerAllocation *other)

{
  __type local_19;
  cmCTestBinPackerAllocation *other_local;
  cmCTestBinPackerAllocation *this_local;
  
  local_19 = false;
  if ((this->ProcessIndex == other->ProcessIndex) &&
     (local_19 = false, this->SlotsNeeded == other->SlotsNeeded)) {
    local_19 = std::operator==(&this->Id,&other->Id);
  }
  return local_19;
}

Assistant:

bool cmCTestBinPackerAllocation::operator==(
  const cmCTestBinPackerAllocation& other) const
{
  return this->ProcessIndex == other.ProcessIndex &&
    this->SlotsNeeded == other.SlotsNeeded && this->Id == other.Id;
}